

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int libssh2_agent_userauth(LIBSSH2_AGENT *agent,char *username,libssh2_agent_publickey *identity)

{
  LIBSSH2_SESSION *session;
  libssh2_agent_publickey *username_00;
  int iVar1;
  time_t start_time;
  size_t username_len;
  time_t entry_time;
  LIBSSH2_AGENT *pLStack_28;
  int rc;
  void *abstract;
  libssh2_agent_publickey *identity_local;
  char *username_local;
  LIBSSH2_AGENT *agent_local;
  
  pLStack_28 = agent;
  abstract = identity;
  identity_local = (libssh2_agent_publickey *)username;
  username_local = (char *)agent;
  if (agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
    memset(&agent->transctx,0,0x30);
    *(undefined8 *)(username_local + 0x48) = *(undefined8 *)((long)abstract + 8);
  }
  start_time = time((time_t *)0x0);
  do {
    username_00 = identity_local;
    session = *(LIBSSH2_SESSION **)username_local;
    username_len = strlen((char *)identity_local);
    iVar1 = _libssh2_userauth_publickey
                      (session,(char *)username_00,username_len,*(uchar **)((long)abstract + 0x10),
                       *(size_t *)((long)abstract + 0x18),agent_sign,&stack0xffffffffffffffd8);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (*(long *)username_local == 0) {
      return -0x25;
    }
    if (*(int *)(*(long *)username_local + 0xac) == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(*(LIBSSH2_SESSION **)username_local,start_time);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_agent_userauth(LIBSSH2_AGENT *agent,
                       const char *username,
                       struct libssh2_agent_publickey *identity)
{
    void *abstract = agent;
    int rc;

    if(agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
        memset(&agent->transctx, 0, sizeof(agent->transctx));
        agent->identity = identity->node;
    }

    BLOCK_ADJUST(rc, agent->session,
                 _libssh2_userauth_publickey(agent->session, username,
                                             strlen(username),
                                             identity->blob,
                                             identity->blob_len,
                                             agent_sign,
                                             &abstract));
    return rc;
}